

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall CVmObjFrameRef::save_to_file(CVmObjFrameRef *this,CVmFile *fp)

{
  int iVar1;
  vm_frameref_ext *this_00;
  vm_val_t *in_RDI;
  vm_val_t *v;
  int i;
  vm_frameref_ext *ext;
  char buf [5];
  CVmFile *in_stack_ffffffffffffffd0;
  vm_val_t *buf_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  this_00 = get_ext((CVmObjFrameRef *)in_RDI);
  if (this_00->fp != (vm_val_t *)0x0) {
    make_snapshot((CVmObjFrameRef *)this_00);
  }
  CVmFile::write_uint2(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  CVmFile::write_uint2(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  vmb_put_dh((char *)in_stack_ffffffffffffffd0,in_RDI);
  CVmFile::write_bytes
            ((CVmFile *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (size_t)in_stack_ffffffffffffffd0);
  vmb_put_dh((char *)in_stack_ffffffffffffffd0,in_RDI);
  CVmFile::write_bytes
            ((CVmFile *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (size_t)in_stack_ffffffffffffffd0);
  CVmFile::write_uint4(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  CVmFile::write_uint4(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  CVmFile::write_uint2(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  vmb_put_dh((char *)in_stack_ffffffffffffffd0,in_RDI);
  CVmFile::write_bytes
            ((CVmFile *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (size_t)in_stack_ffffffffffffffd0);
  buf_00 = this_00->vars;
  for (iVar1 = this_00->nparams + this_00->nlocals; 0 < iVar1; iVar1 = iVar1 + -1) {
    vmb_put_dh((char *)buf_00,in_RDI);
    CVmFile::write_bytes
              ((CVmFile *)this_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),(size_t)buf_00);
    buf_00 = buf_00 + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::save_to_file(VMG_ class CVmFile *fp)
{
    char buf[VMB_DATAHOLDER];
    
    /* get our extension */
    vm_frameref_ext *ext = get_ext();
    
    /* 
     *   If our frame is still active, make a snapshot of the variables.  The
     *   stack frame itself is inherently transient, so we can only save the
     *   snapshot version.  
     */
    if (ext->fp != 0)
        make_snapshot(vmg0_);

    /* save the variable counts */
    fp->write_uint2(ext->nlocals);
    fp->write_uint2(ext->nparams);

    /* save the entry pointer */
    vmb_put_dh(buf, &ext->entry);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* save the method context values */
    vmb_put_dh(buf, &ext->self);
    fp->write_bytes(buf, VMB_DATAHOLDER);
    fp->write_uint4(ext->defobj);
    fp->write_uint4(ext->targobj);
    fp->write_uint2(ext->targprop);
    vmb_put_dh(buf, &ext->invokee);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* save the variable snapshot values */
    int i;
    const vm_val_t *v;
    for (i = ext->nparams + ext->nlocals, v = ext->vars ; i > 0 ; --i, ++v)
    {
        vmb_put_dh(buf, v);
        fp->write_bytes(buf, VMB_DATAHOLDER);
    }
}